

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aphy_impl.hpp
# Opt level: O0

ref<aphy::engine> aphy::makeObjectWithInterface<aphy::engine,APhyBullet::BulletEngine>(void)

{
  pointer theCounter;
  Counter *in_RDI;
  unique_ptr<aphy::ref_counter<aphy::engine>,_std::default_delete<aphy::ref_counter<aphy::engine>_>_>
  counter;
  unique_ptr<APhyBullet::BulletEngine,_std::default_delete<APhyBullet::BulletEngine>_> object;
  pointer in_stack_ffffffffffffffa8;
  ref_counter<aphy::engine> *in_stack_ffffffffffffffb0;
  unique_ptr<APhyBullet::BulletEngine,_std::default_delete<APhyBullet::BulletEngine>_> *this;
  unique_ptr<APhyBullet::BulletEngine,_std::default_delete<APhyBullet::BulletEngine>_> local_28 [5];
  
  ::operator_new(0x10);
  APhyBullet::BulletEngine::BulletEngine((BulletEngine *)in_stack_ffffffffffffffb0);
  std::unique_ptr<APhyBullet::BulletEngine,std::default_delete<APhyBullet::BulletEngine>>::
  unique_ptr<std::default_delete<APhyBullet::BulletEngine>,void>
            ((unique_ptr<APhyBullet::BulletEngine,_std::default_delete<APhyBullet::BulletEngine>_> *
             )in_stack_ffffffffffffffb0,(pointer)in_stack_ffffffffffffffa8);
  ::operator_new(0x18);
  std::unique_ptr<APhyBullet::BulletEngine,_std::default_delete<APhyBullet::BulletEngine>_>::release
            ((unique_ptr<APhyBullet::BulletEngine,_std::default_delete<APhyBullet::BulletEngine>_> *
             )0x12b16c);
  ref_counter<aphy::engine>::ref_counter
            (in_stack_ffffffffffffffb0,(engine *)in_stack_ffffffffffffffa8);
  this = local_28;
  std::
  unique_ptr<aphy::ref_counter<aphy::engine>,std::default_delete<aphy::ref_counter<aphy::engine>>>::
  unique_ptr<std::default_delete<aphy::ref_counter<aphy::engine>>,void>
            ((unique_ptr<aphy::ref_counter<aphy::engine>,_std::default_delete<aphy::ref_counter<aphy::engine>_>_>
              *)this,in_stack_ffffffffffffffa8);
  theCounter = std::
               unique_ptr<aphy::ref_counter<aphy::engine>,_std::default_delete<aphy::ref_counter<aphy::engine>_>_>
               ::release((unique_ptr<aphy::ref_counter<aphy::engine>,_std::default_delete<aphy::ref_counter<aphy::engine>_>_>
                          *)0x12b199);
  ref<aphy::engine>::ref((ref<aphy::engine> *)in_RDI,theCounter);
  std::
  unique_ptr<aphy::ref_counter<aphy::engine>,_std::default_delete<aphy::ref_counter<aphy::engine>_>_>
  ::~unique_ptr((unique_ptr<aphy::ref_counter<aphy::engine>,_std::default_delete<aphy::ref_counter<aphy::engine>_>_>
                 *)this);
  std::unique_ptr<APhyBullet::BulletEngine,_std::default_delete<APhyBullet::BulletEngine>_>::
  ~unique_ptr(this);
  return (ref<aphy::engine>)in_RDI;
}

Assistant:

inline ref<I> makeObjectWithInterface(Args... args)
{
    std::unique_ptr<T> object(new T(args...));
    std::unique_ptr<ref_counter<I>> counter(new ref_counter<I> (object.release()));
    return ref<I> (counter.release());
}